

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O3

void __thiscall
lossless_neural_sound::expression_compiler::expression::Element_variable::write_indexes
          (Element_variable *this,ostream *os)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  
  lVar3 = 0;
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    lVar3 = lVar3 + (ulong)((this->matrix_variable->sizes)._M_elems[lVar5] != 1);
    lVar5 = 1;
    bVar1 = false;
  } while (bVar4);
  if (lVar3 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
    os = std::ostream::_M_insert<unsigned_long>((ulong)os);
    pcVar6 = "]";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
    lVar3 = 0;
    pcVar6 = "";
    do {
      sVar2 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar2);
      std::ostream::_M_insert<unsigned_long>((ulong)os);
      lVar3 = lVar3 + 8;
      pcVar6 = ", ";
    } while (lVar3 != 0x10);
    pcVar6 = ")";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,1);
  return;
}

Assistant:

void write_indexes(std::ostream &os) const
    {
        std::size_t non_unit_dimension_count = 0;
        std::size_t non_unit_dimension_index = 0;
        for(std::size_t i = 0; i < indexes.size(); i++)
        {
            if(matrix_variable->sizes[i] != 1)
            {
                non_unit_dimension_count++;
                non_unit_dimension_index = i;
            }
        }
        if(non_unit_dimension_count == 1)
        {
            os << "[" << indexes[indexes.size() - 1 - non_unit_dimension_index] << "]";
        }
        else
        {
            auto separator = "";
            os << "(";
            for(std::size_t i : indexes)
            {
                os << separator << i;
                separator = ", ";
            }
            os << ")";
        }
    }